

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCsgSolid::IfcCsgSolid(IfcCsgSolid *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcCsgSolid";
  IfcSolidModel::IfcSolidModel(&this->super_IfcSolidModel,&PTR_construction_vtable_24__00816070);
  *(undefined8 *)&(this->super_IfcSolidModel).field_0x38 = 0;
  (this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x815fb8;
  *(undefined8 *)&this->field_0x50 = 0x816058;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x815fe0;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x816008;
  *(undefined8 *)&(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       0x816030;
  *(undefined8 *)&(this->super_IfcSolidModel).field_0x40 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  return;
}

Assistant:

IfcCsgSolid() : Object("IfcCsgSolid") {}